

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O3

int os_date(lua_State *L)

{
  lua_State *plVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *__s1;
  tm *stm;
  char *__s;
  size_t sVar5;
  char *option;
  char *pcVar6;
  int oplen;
  char cc [4];
  time_t t;
  luaL_Buffer b;
  char local_2064;
  undefined1 local_2063 [3];
  lua_State *local_2060;
  lua_Integer local_2058;
  luaL_Buffer local_2050;
  
  __s1 = luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar3 = lua_type(L,2);
  if (iVar3 < 1) {
    local_2058 = time((time_t *)0x0);
  }
  else {
    local_2058 = luaL_checkinteger(L,2);
  }
  local_2060 = L;
  if (*__s1 == '!') {
    stm = (tm *)gmtime(&local_2058);
    __s1 = __s1 + 1;
  }
  else {
    stm = (tm *)localtime(&local_2058);
  }
  if (stm == (tm *)0x0) {
    luaL_error(local_2060,"time result cannot be represented in this installation");
  }
  plVar1 = local_2060;
  if (((*__s1 == '*') && (__s1[1] == 't')) && (__s1[2] == '\0')) {
    lua_createtable(local_2060,0,9);
    setallfields(plVar1,stm);
    return 1;
  }
  local_2064 = '%';
  luaL_buffinit(local_2060,&local_2050);
LAB_0011db96:
  for (; cVar2 = *__s1, cVar2 != '%'; __s1 = __s1 + 1) {
    if (cVar2 == '\0') {
      luaL_pushresult(&local_2050);
      return 1;
    }
    if (local_2050.size <= local_2050.n) {
      luaL_prepbuffsize(&local_2050,1);
      cVar2 = *__s1;
    }
    local_2050.b[local_2050.n] = cVar2;
    local_2050.n = local_2050.n + 1;
  }
  __s = luaL_prepbuffsize(&local_2050,0xfa);
  __s1 = __s1 + 1;
  iVar3 = 1;
  pcVar6 = "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy";
  do {
    plVar1 = local_2060;
    if (*pcVar6 == '|') {
      iVar3 = iVar3 + 1;
      sVar5 = (size_t)iVar3;
    }
    else {
      if (*pcVar6 == '\0') {
        pcVar6 = lua_pushfstring(local_2060,"invalid conversion specifier \'%%%s\'",__s1);
        luaL_argerror(plVar1,1,pcVar6);
        goto LAB_0011dc75;
      }
      sVar5 = (size_t)iVar3;
      iVar4 = bcmp(__s1,pcVar6,sVar5);
      if (iVar4 == 0) break;
    }
    pcVar6 = pcVar6 + sVar5;
  } while( true );
  memcpy(local_2063,__s1,sVar5);
  local_2063[sVar5] = 0;
  __s1 = __s1 + sVar5;
LAB_0011dc75:
  sVar5 = strftime(__s,0xfa,&local_2064,(tm *)stm);
  local_2050.n = local_2050.n + sVar5;
  goto LAB_0011db96;
}

Assistant:

static int os_date (lua_State *L) {
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    luaL_error(L, "time result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (*s) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s = checkoption(L, s + 1, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}